

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

Aig_Man_t * Aig_ManStartFrom(Aig_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_2c;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  pAVar3 = Aig_ManConst1(p_00);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).pData = pAVar3;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_2c);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(ulong *)&pAVar3->field_0x18 =
         *(ulong *)&pAVar3->field_0x18 & 0xff000000ffffffff |
         (ulong)((uint)((ulong)*(undefined8 *)((long)pvVar5 + 0x18) >> 0x20) & 0xffffff) << 0x20;
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManStartFrom( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    return pNew;
}